

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O2

void __thiscall bal::Formula::named_variables_update(Formula *this,VariablesArray *source)

{
  _Base_ptr p_Var1;
  _Self __tmp;
  
  for (p_Var1 = (this->named_variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->named_variables_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    VariablesArray::assign_template_into
              (source,(VariablesArray *)(p_Var1 + 2),(VariablesArray *)(p_Var1 + 2));
  }
  return;
}

Assistant:

void Formula::named_variables_update(const VariablesArray& source) {
        for (auto vit = named_variables_.begin(); vit != named_variables_.end(); vit++) {
            source.assign_template_into(vit->second, vit->second);
        };
    }